

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O2

int WebPPictureAllocARGB(WebPPicture *picture)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  
  iVar3 = picture->width;
  iVar1 = picture->height;
  iVar2 = WebPValidatePicture(picture);
  if (iVar2 == 0) {
    iVar3 = 0;
  }
  else {
    WebPSafeFree(picture->memory_argb_);
    picture->memory_argb_ = (void *)0x0;
    picture->argb = (uint32_t *)0x0;
    picture->argb_stride = 0;
    pvVar4 = WebPSafeMalloc((long)iVar1 * (long)iVar3 + 0x1f,4);
    if (pvVar4 == (void *)0x0) {
      iVar3 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar3;
    }
    picture->memory_argb_ = pvVar4;
    picture->argb = (uint32_t *)((long)pvVar4 + 0x1fU & 0xffffffffffffffe0);
    picture->argb_stride = iVar3;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int WebPPictureAllocARGB(WebPPicture* const picture) {
  void* memory;
  const int width = picture->width;
  const int height = picture->height;
  const uint64_t argb_size = (uint64_t)width * height;

  if (!WebPValidatePicture(picture)) return 0;

  WebPSafeFree(picture->memory_argb_);
  WebPPictureResetBufferARGB(picture);

  // allocate a new buffer.
  memory = WebPSafeMalloc(argb_size + WEBP_ALIGN_CST, sizeof(*picture->argb));
  if (memory == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  picture->memory_argb_ = memory;
  picture->argb = (uint32_t*)WEBP_ALIGN(memory);
  picture->argb_stride = width;
  return 1;
}